

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void analyze_C_types(C_Decl_Analysis *analysis,C_Type *ty)

{
  TypeKind TVar1;
  char *pcVar2;
  C_Member *pCVar3;
  
  TVar1 = ty->kind;
  if (TVar1 == TY_PTR) {
    pcVar2 = "Declaring pointer type is not allowed\n";
  }
  else {
    if (TVar1 != TY_UNION) {
      if (TVar1 != TY_STRUCT) {
        return;
      }
      for (pCVar3 = ty->members; pCVar3 != (C_Member *)0x0; pCVar3 = pCVar3->next) {
        analyze_C_types(analysis,pCVar3->ty);
      }
      return;
    }
    pcVar2 = "Declaring union type is not allowed\n";
  }
  (*analysis->api->error_message)(analysis->api->context,pcVar2);
  analysis->status = analysis->status + -1;
  return;
}

Assistant:

static void analyze_C_types(C_Decl_Analysis *analysis, C_Type *ty)
{
	struct Ravi_CompilerInterface *api = analysis->api;
	if (ty->kind == TY_STRUCT) {
		for (C_Member *mem = ty->members; mem; mem = mem->next) {
			analyze_C_types(analysis, mem->ty);
		}
	} else if (ty->kind == TY_PTR) {
		api->error_message(api->context, "Declaring pointer type is not allowed\n");
		analysis->status--;
	} else if (ty->kind == TY_UNION) {
		api->error_message(api->context, "Declaring union type is not allowed\n");
		analysis->status--;
	}
}